

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

ProcessorRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorBase>&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::ProcessorBase> *args_1)

{
  pool_ref<soul::AST::ProcessorBase> *c;
  Context *this_00;
  ProcessorBase *p;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_31;
  ProcessorRef *local_30;
  ProcessorRef *newObject;
  PoolItem *newItem;
  pool_ref<soul::AST::ProcessorBase> *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (pool_ref<soul::AST::ProcessorBase> *)args;
  args_local = (Context *)this;
  newObject = (ProcessorRef *)allocateSpaceForObject(this,0x38);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  p = pool_ref::operator_cast_to_ProcessorBase_((pool_ref *)newItem);
  AST::ProcessorRef::ProcessorRef((ProcessorRef *)this_00,(Context *)c,p);
  local_30 = (ProcessorRef *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::pool_ref&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(&local_31);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }